

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O0

Mig_Man_t * Mig_ManCreate(void *pGia)

{
  int iVar1;
  int iCtrl;
  uint uVar2;
  int iVar3;
  Mig_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Mig_Man_t *pNew;
  Gia_Man_t *p;
  void *pGia_local;
  
  p_00 = Mig_ManStart();
  pcVar4 = Abc_UtilStrsav(*pGia);
  p_00->pName = pcVar4;
  pGVar5 = Gia_ManConst0((Gia_Man_t *)pGia);
  pGVar5->Value = 0;
  local_2c = 1;
  while( true ) {
    bVar6 = false;
    if (local_2c < *(int *)((long)pGia + 0x18)) {
      pGStack_28 = Gia_ManObj((Gia_Man_t *)pGia,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsMuxId((Gia_Man_t *)pGia,local_2c);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsXor(pGStack_28);
      if (iVar3 == 0) {
        iVar3 = Gia_ObjIsAnd(pGStack_28);
        if (iVar3 == 0) {
          iVar3 = Gia_ObjIsCi(pGStack_28);
          if (iVar3 == 0) {
            iVar3 = Gia_ObjIsCo(pGStack_28);
            if (iVar3 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                            ,0x68,"Mig_Man_t *Mig_ManCreate(void *)");
            }
            iVar3 = Mig_ObjFanin0Copy(pGStack_28);
            uVar2 = Mig_ManAppendCo(p_00,iVar3);
            pGStack_28->Value = uVar2;
          }
          else {
            uVar2 = Mig_ManAppendCi(p_00);
            pGStack_28->Value = uVar2;
          }
        }
        else {
          iVar3 = Mig_ObjFanin0Copy(pGStack_28);
          iVar1 = Mig_ObjFanin1Copy(pGStack_28);
          uVar2 = Mig_ManAppendAnd(p_00,iVar3,iVar1);
          pGStack_28->Value = uVar2;
        }
      }
      else {
        iVar3 = Gia_ObjFanin0Copy(pGStack_28);
        iVar1 = Gia_ObjFanin1Copy(pGStack_28);
        uVar2 = Mig_ManAppendXor(p_00,iVar3,iVar1);
        pGStack_28->Value = uVar2;
      }
    }
    else {
      iVar3 = Gia_ObjFanin0Copy(pGStack_28);
      iVar1 = Gia_ObjFanin1Copy(pGStack_28);
      iCtrl = Gia_ObjFanin2Copy((Gia_Man_t *)pGia,pGStack_28);
      uVar2 = Mig_ManAppendMux(p_00,iVar3,iVar1,iCtrl);
      pGStack_28->Value = uVar2;
    }
    local_2c = local_2c + 1;
  }
  iVar3 = Gia_ManRegNum((Gia_Man_t *)pGia);
  Mig_ManSetRegNum(p_00,iVar3);
  iVar3 = Gia_ManHasChoices((Gia_Man_t *)pGia);
  if (iVar3 != 0) {
    Mig_ManCreateChoices(p_00,(Gia_Man_t *)pGia);
  }
  return p_00;
}

Assistant:

Mig_Man_t * Mig_ManCreate( void * pGia )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Mig_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Mig_ManStart();
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Mig_ManAppendMux( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin2Copy(p, pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Mig_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Mig_ManAppendAnd( pNew, Mig_ObjFanin0Copy(pObj), Mig_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Mig_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Mig_ManAppendCo( pNew, Mig_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    Mig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( Gia_ManHasChoices(p) )
        Mig_ManCreateChoices( pNew, p );
    return pNew;
}